

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * anon_unknown.dwarf_12e14a::CreateSub
                    (VmModule *module,SynBase *source,VmValue *lhs,VmValue *rhs)

{
  VmValueType VVar1;
  uint uVar2;
  VmInstruction *pVVar3;
  VmType type;
  VmValue *in_stack_fffffffffffffff8;
  
  VVar1 = (lhs->type).type;
  uVar2 = (lhs->type).size;
  if ((uVar2 != 4 || VVar1 != VM_TYPE_INT) &&
     (((VVar1 & ~VM_TYPE_INT) != VM_TYPE_DOUBLE || (uVar2 != 8)))) {
    __assert_fail("lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x234,
                  "VmValue *(anonymous namespace)::CreateSub(VmModule *, SynBase *, VmValue *, VmValue *)"
                 );
  }
  if ((VVar1 == (rhs->type).type) && (uVar2 == (rhs->type).size)) {
    type.structType = (TypeBase *)0x23;
    type._0_8_ = (lhs->type).structType;
    pVVar3 = CreateInstruction((anon_unknown_dwarf_12e14a *)module,(VmModule *)source,
                               *(SynBase **)&lhs->type,type,(VmInstructionType)lhs,rhs,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               in_stack_fffffffffffffff8);
    return &pVVar3->super_VmValue;
  }
  __assert_fail("lhs->type == rhs->type",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x235,
                "VmValue *(anonymous namespace)::CreateSub(VmModule *, SynBase *, VmValue *, VmValue *)"
               );
}

Assistant:

VmValue* CreateSub(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Double || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_SUB, lhs, rhs);
	}